

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall cimg_library::CImgDisplay::paint(CImgDisplay *this,bool wait_expose)

{
  Display *pDVar1;
  bool bVar2;
  X11_info *pXVar3;
  CImgDisplay *in_RDI;
  Display *dpy;
  undefined7 in_stack_00000010;
  
  bVar2 = is_empty(in_RDI);
  if (!bVar2) {
    pXVar3 = cimg::X11_attr();
    pDVar1 = pXVar3->display;
    XLockDisplay(pDVar1);
    _paint((CImgDisplay *)CONCAT17(wait_expose,in_stack_00000010),dpy._7_1_);
    XUnlockDisplay(pDVar1);
  }
  return in_RDI;
}

Assistant:

CImgDisplay& paint(const bool wait_expose=true) {
      if (is_empty()) return *this;
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      _paint(wait_expose);
      XUnlockDisplay(dpy);
      return *this;
    }